

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaExist.c
# Opt level: O2

void Gia_ManQuantMarkUsedCis(Gia_Man_t *p,_func_int_void_ptr_int *pFuncCiToKeep,void *pData)

{
  int iVar1;
  word *pIn1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar4 = 0;
  pIn1 = Gia_ManQuantInfoId(p,0);
  uVar3 = p->nSuppWords;
  uVar2 = 0;
  if (0 < (int)uVar3) {
    uVar2 = (ulong)uVar3;
  }
  for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    pIn1[uVar4] = 0;
  }
  iVar1 = Abc_TtIsConst0(pIn1,uVar3);
  if (iVar1 != 0) {
    for (uVar3 = 0; (int)uVar3 < (p->vSuppVars).nSize; uVar3 = uVar3 + 1) {
      iVar1 = Vec_IntEntry(&p->vSuppVars,uVar3);
      iVar1 = (*pFuncCiToKeep)(pData,iVar1);
      if (iVar1 == 0) {
        pIn1[uVar3 >> 6] = pIn1[uVar3 >> 6] | 1L << ((byte)uVar3 & 0x3f);
      }
    }
    return;
  }
  __assert_fail("Abc_TtIsConst0(pInfo, p->nSuppWords)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaExist.c"
                ,0xac,"void Gia_ManQuantMarkUsedCis(Gia_Man_t *, int (*)(void *, int), void *)");
}

Assistant:

void Gia_ManQuantMarkUsedCis( Gia_Man_t * p, int(*pFuncCiToKeep)(void *, int), void * pData )
{
    int i, CiId;
    word * pInfo = Gia_ManQuantInfoId( p, 0 );
    Abc_TtClear( pInfo, p->nSuppWords );
    assert( Abc_TtIsConst0(pInfo, p->nSuppWords) );
    Vec_IntForEachEntry( &p->vSuppVars, CiId, i )
        if ( !pFuncCiToKeep( pData, CiId ) ) // quant var
            Abc_TtSetBit( pInfo, i );
}